

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O2

void __thiscall OpenMD::EAM::calcDensity(EAM *this,InteractionData *idat)

{
  pointer piVar1;
  EAM *this_00;
  pointer pEVar2;
  pointer pEVar3;
  RealType RVar4;
  double dVar5;
  double local_30;
  
  this_00 = this;
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar1 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (this->EAMdata).
           super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar5 = idat->rij;
  if ((this->haveCutoffRadius_ != true) || (dVar5 < this->eamRcut_ || dVar5 == this->eamRcut_)) {
    pEVar3 = pEVar2 + piVar1[idat->atid1];
    pEVar2 = pEVar2 + piVar1[idat->atid2];
    if (dVar5 < pEVar3->rcut) {
      if (pEVar3->isFluctuatingCharge == true) {
        if (this->mixMeth_ == eamDream2) {
          local_30 = gFunc(this_00,idat->flucQ1,pEVar3->nValence,pEVar3->nMobile);
        }
        else {
          local_30 = (pEVar3->nValence - idat->flucQ1) / pEVar3->nValence;
        }
      }
      else {
        local_30 = 1.0;
      }
      this_00 = (EAM *)(pEVar3->rho).
                       super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      RVar4 = CubicSpline::getValueAt((CubicSpline *)this_00,&idat->rij);
      idat->rho2 = RVar4 * local_30 + idat->rho2;
      dVar5 = idat->rij;
    }
    if (dVar5 < pEVar2->rcut) {
      if (pEVar2->isFluctuatingCharge == true) {
        if (this->mixMeth_ == eamDream2) {
          local_30 = gFunc(this_00,idat->flucQ2,pEVar2->nValence,pEVar2->nMobile);
        }
        else {
          local_30 = (pEVar2->nValence - idat->flucQ2) / pEVar2->nValence;
        }
      }
      else {
        local_30 = 1.0;
      }
      RVar4 = CubicSpline::getValueAt
                        ((pEVar2->rho).
                         super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &idat->rij);
      idat->rho1 = RVar4 * local_30 + idat->rho1;
    }
  }
  return;
}

Assistant:

void EAM::calcDensity(InteractionData& idat) {
    if (!initialized_) initialize();

    EAMAtomData& data1 = EAMdata[EAMtids[idat.atid1]];
    EAMAtomData& data2 = EAMdata[EAMtids[idat.atid2]];
    RealType s;

    if (haveCutoffRadius_)
      if (idat.rij > eamRcut_) return;

    if (idat.rij < data1.rcut) {
      s = 1.0;
      if (data1.isFluctuatingCharge) {
        if (mixMeth_ == eamDream2)
          s = gFunc(idat.flucQ1, data1.nValence, data1.nMobile);
        else
          s = (data1.nValence - idat.flucQ1) / (data1.nValence);
      }
      idat.rho2 += s * data1.rho->getValueAt(idat.rij);
    }

    if (idat.rij < data2.rcut) {
      s = 1.0;
      if (data2.isFluctuatingCharge) {
        if (mixMeth_ == eamDream2)
          s = gFunc(idat.flucQ2, data2.nValence, data2.nMobile);
        else
          s = (data2.nValence - idat.flucQ2) / (data2.nValence);
      }
      idat.rho1 += s * data2.rho->getValueAt(idat.rij);
    }

    return;
  }